

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * c4::aalloc(size_t sz,size_t alignment)

{
  bool bVar1;
  error_flags eVar2;
  aalloc_pfn p_Var3;
  void *pvVar4;
  size_t in_RSI;
  size_t in_RDI;
  void *ptr;
  aalloc_pfn fn;
  
  p_Var3 = get_aalloc();
  if (p_Var3 == (aalloc_pfn)0x0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x3f0daf,(char *)0x4417,
                 "check failed: c4::get_aalloc() != nullptr\ndid you forget to call set_aalloc()?");
  }
  p_Var3 = get_aalloc();
  pvVar4 = (*p_Var3)(in_RDI,in_RSI);
  return pvVar4;
}

Assistant:

void* aalloc(size_t sz, size_t alignment)
{
    C4_ASSERT_MSG(c4::get_aalloc() != nullptr, "did you forget to call set_aalloc()?");
    auto fn = c4::get_aalloc();
    void* ptr = fn(sz, alignment);
    return ptr;
}